

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O0

Atom_t __thiscall Potassco::ProgramReader::matchAtom(ProgramReader *this,char *err)

{
  Atom_t AVar1;
  ProgramReader *in_RDI;
  char *unaff_retaddr;
  
  stream(in_RDI);
  AVar1 = Potassco::matchAtom((BufferedStream *)this,err._4_4_,unaff_retaddr);
  return AVar1;
}

Assistant:

Atom_t   matchAtom(const char* err = "atom expected") { return Potassco::matchAtom(*stream(), varMax_, err); }